

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O2

void absl::lts_20240722::SubstituteAndAppend
               (Nonnull<std::string_*> output,string_view format,Arg *a0,Arg *a1,Arg *a2,Arg *a3,
               Arg *a4,Arg *a5)

{
  string_view args [6];
  
  args[0]._M_len = (a0->piece_)._M_len;
  args[0]._M_str = (a0->piece_)._M_str;
  args[1]._M_len = (a1->piece_)._M_len;
  args[1]._M_str = (a1->piece_)._M_str;
  args[2]._M_len = (a2->piece_)._M_len;
  args[2]._M_str = (a2->piece_)._M_str;
  args[3]._M_len = (a3->piece_)._M_len;
  args[3]._M_str = (a3->piece_)._M_str;
  args[4]._M_len = (a4->piece_)._M_len;
  args[4]._M_str = (a4->piece_)._M_str;
  args[5]._M_len._0_4_ = (undefined4)(a5->piece_)._M_len;
  args[5]._M_len._4_4_ = *(undefined4 *)((long)&(a5->piece_)._M_len + 4);
  args[5]._M_str._0_4_ = *(undefined4 *)&(a5->piece_)._M_str;
  args[5]._M_str._4_4_ = *(undefined4 *)((long)&(a5->piece_)._M_str + 4);
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (output,format._M_len,format._M_str,args,6);
  return;
}

Assistant:

inline void SubstituteAndAppend(
    absl::Nonnull<std::string*> output, absl::string_view format,
    const substitute_internal::Arg& a0, const substitute_internal::Arg& a1,
    const substitute_internal::Arg& a2, const substitute_internal::Arg& a3,
    const substitute_internal::Arg& a4, const substitute_internal::Arg& a5) {
  const absl::string_view args[] = {a0.piece(), a1.piece(), a2.piece(),
                                    a3.piece(), a4.piece(), a5.piece()};
  substitute_internal::SubstituteAndAppendArray(output, format, args,
                                                ABSL_ARRAYSIZE(args));
}